

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk * modified_chunk(player *p,wchar_t height,wchar_t width,_Bool persistent)

{
  wchar_t m;
  room_profile *prVar1;
  ulong uVar2;
  room_profile profile;
  _Bool _Var3;
  wchar_t wVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  chunk *c;
  _Bool **pp_Var8;
  _Bool *p_Var9;
  undefined1 (*pauVar10) [12];
  dun_data *pdVar11;
  ulong uVar12;
  wchar_t wVar13;
  ulong uVar14;
  long lVar15;
  
  m = dun->profile->dun_unusual;
  wVar6 = dun->profile->n_room_profiles;
  c = (chunk *)cave_new(height,width);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  wVar4 = c->height;
  wVar13 = c->width;
  uVar2 = (long)(wVar13 * wVar4) / 7;
  if ((player->opts).opt[0x18] == true) {
    msg("height=%d  width=%d  nfloors=%d",(ulong)(uint)wVar4,(ulong)(uint)wVar13,uVar2 & 0xffffffff)
    ;
    wVar4 = c->height;
    wVar13 = c->width;
  }
  fill_rectangle(c,L'\0',L'\0',wVar4 + L'\xffffffff',wVar13 + L'\xffffffff',FEAT_GRANITE,L'\0');
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_PERM,L'\0',
                 true);
  pdVar11 = dun;
  wVar4 = c->height / dun->block_hgt;
  dun->row_blocks = wVar4;
  pdVar11->col_blocks = c->width / pdVar11->block_wid;
  pp_Var8 = (_Bool **)mem_zalloc((long)wVar4 << 3);
  pdVar11 = dun;
  dun->room_map = pp_Var8;
  for (lVar15 = 0; lVar15 < pdVar11->row_blocks; lVar15 = lVar15 + 1) {
    p_Var9 = (_Bool *)mem_zalloc((long)pdVar11->col_blocks);
    dun->room_map[lVar15] = p_Var9;
    pdVar11 = dun;
  }
  pdVar11->pit_num = L'\0';
  pdVar11->cent_n = L'\0';
  reset_entrance_data(c);
  if (persistent) {
    build_staircase_rooms(c,"Modified Generation");
  }
  uVar12 = 0;
  uVar14 = (ulong)(uint)wVar6;
  if (wVar6 < L'\x01') {
    uVar14 = uVar12;
  }
  do {
    if (((int)uVar2 <= c->feat_count[FEAT_FLOOR]) && (L'\x01' < dun->cent_n)) {
      for (lVar15 = 0; lVar15 < dun->row_blocks; lVar15 = lVar15 + 1) {
        mem_free(dun->room_map[lVar15]);
      }
      mem_free(dun->room_map);
      do_traditional_tunneling(c);
      ensure_connectedness(c,true);
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_GRANITE,
                     L'\0',true);
      return c;
    }
    if ((int)uVar12 == 0x1f5) {
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      return (chunk *)0x0;
    }
    uVar12 = (ulong)((int)uVar12 + 1);
    uVar5 = Rand_div(100);
    wVar6 = L'\0';
    for (wVar4 = L'\0'; (wVar6 == wVar4 && (wVar4 < dun->profile->max_rarity));
        wVar4 = (uint)((int)uVar7 < c->depth / 2 + 0x32) + wVar4) {
      uVar7 = Rand_div(m);
      wVar6 = wVar4 + L'\x01';
    }
    for (lVar15 = 0; uVar14 * 0x38 - lVar15 != 0; lVar15 = lVar15 + 0x38) {
      prVar1 = dun->profile->room_profiles;
      if ((*(wchar_t *)((long)&prVar1->rarity + lVar15) <= wVar4) &&
         ((int)uVar5 < *(int *)((long)&prVar1->cutoff + lVar15))) {
        pauVar10 = (undefined1 (*) [12])((long)&prVar1->next + lVar15);
        profile.name._4_4_ = (int)((ulong)*(undefined8 *)(*pauVar10 + 8) >> 0x20);
        profile._0_12_ = *pauVar10;
        profile.builder = (room_builder)*(undefined8 *)(pauVar10[1] + 4);
        profile.rating = *(wchar_t *)((long)(pauVar10 + 2) + 0);
        profile.height = *(wchar_t *)((long)(pauVar10 + 2) + 4);
        profile._32_8_ = *(undefined8 *)(pauVar10[2] + 8);
        profile._40_8_ = *(undefined8 *)(pauVar10[3] + 4);
        profile._48_8_ = *(undefined8 *)pauVar10[4];
        _Var3 = room_build(c,L'\0',L'\0',profile,true);
        if (_Var3) break;
      }
    }
  } while( true );
}

Assistant:

static struct chunk *modified_chunk(struct player *p, int height, int width,
									bool persistent)
{
	int i;
	int by = 0, bx = 0, key, rarity;
	int num_floors;
	int num_rooms = dun->profile->n_room_profiles;
	int dun_unusual = dun->profile->dun_unusual;
	int n_attempt;

	/* Make the cave */
	struct chunk *c = cave_new(height, width);
	c->depth = p->depth;
	c->place = p->place;

	/* Set the intended number of floor grids based on cave floor area */
	num_floors = c->height * c->width / 7;
	ROOM_LOG("height=%d  width=%d  nfloors=%d", c->height, c->width,num_floors);

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE);

	/* Generate permanent walls around the generated area (temporarily!) */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Actual maximum number of blocks on this level */
	dun->row_blocks = c->height / dun->block_hgt;
	dun->col_blocks = c->width / dun->block_wid;

	/* Initialize the room table */
	dun->room_map = mem_zalloc(dun->row_blocks * sizeof(bool*));
	for (i = 0; i < dun->row_blocks; i++)
		dun->room_map[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* No rooms yet, pits or otherwise. */
	dun->pit_num = 0;
	dun->cent_n = 0;
	reset_entrance_data(c);

	/* Build the special staircase rooms */
	if (persistent) {
		build_staircase_rooms(c, "Modified Generation");
	}

	/*
	 * Build rooms until we have enough floor grids and at least two rooms
	 * or we appear to be stuck and can't match those criteria.
	 */
	n_attempt = 0;
	while (1) {
		if (c->feat_count[FEAT_FLOOR] >= num_floors
				&& dun->cent_n >= 2) {
			break;
		}
		/*
		 * At an average of roughly 22 successful rooms per level
		 * (and a standard deviation of 4.5 or so for that) and a
		 * room failure rate that's less than .5 failures per success
		 * (4.2.x profile doesn't use full allocation for rarity two
		 * rooms - only up to 60; and the last type tried in that
		 * rarity has a failure rate per successful rooms of all types
		 * of around .024).  500 attempts is a generous cutoff for
		 * saying no further progress is likely.
		 */
		if (n_attempt > 500) {
			uncreate_artifacts(c);
			wipe_mon_list(c, p);
			cave_free(c);
			return NULL;
		}
		++n_attempt;

		/* Roll for random key (to be compared against a profile's cutoff) */
		key = randint0(100);

		/* We generate a rarity number to figure out how exotic to make
		 * the room. This number has a (50+depth/2)/DUN_UNUSUAL chance
		 * of being > 0, a (50+depth/2)^2/DUN_UNUSUAL^2 chance of
		 * being > 1, up to MAX_RARITY. */
		i = 0;
		rarity = 0;
		while (i == rarity && i < dun->profile->max_rarity) {
			if (randint0(dun_unusual) < 50 + c->depth / 2) rarity++;
			i++;
		}

		/* Once we have a key and a rarity, we iterate through out list of
		 * room profiles looking for a match (whose cutoff > key and whose
		 * rarity > this rarity). We try building the room, and if it works
		 * then we are done with this iteration. We keep going until we find
		 * a room that we can build successfully or we exhaust the profiles. */
		for (i = 0; i < num_rooms; i++) {
			struct room_profile profile = dun->profile->room_profiles[i];
			if (profile.rarity > rarity) continue;
			if (profile.cutoff <= key) continue;
			if (room_build(c, by, bx, profile, true)) break;
		}
	}

	for (i = 0; i < dun->row_blocks; i++)
		mem_free(dun->room_map[i]);
	mem_free(dun->room_map);

	/* Connect all the rooms together */
	do_traditional_tunneling(c);
	ensure_connectedness(c, true);

	/* Turn the outer permanent walls back to granite */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE, true);

	return c;
}